

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

void GetWin32EscapedString(string *input,string *result)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  const_iterator end;
  const_iterator it;
  const_iterator span_begin;
  size_t consecutive_backslash_count;
  char kBackslash;
  char kQuote;
  string *result_local;
  string *input_local;
  
  if (result != (string *)0x0) {
    bVar1 = StringNeedsWin32Escaping(input);
    if (bVar1) {
      std::__cxx11::string::push_back((char)result);
      span_begin._M_current = (char *)0x0;
      it._M_current = (char *)std::__cxx11::string::begin();
      end._M_current = (char *)std::__cxx11::string::begin();
      local_40._M_current = (char *)std::__cxx11::string::end();
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&end,&local_40);
        if (!bVar1) break;
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&end);
        if (*pcVar2 == '\"') {
          std::__cxx11::string::
          append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                    ((string *)result,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )it._M_current,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )end._M_current);
          std::__cxx11::string::append((ulong)result,(char)span_begin._M_current + '\x01');
          it = end;
          span_begin._M_current = (char *)0x0;
        }
        else if (*pcVar2 == '\\') {
          span_begin._M_current = span_begin._M_current + 1;
        }
        else {
          span_begin._M_current = (char *)0x0;
        }
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&end);
      }
      __last._M_current = (char *)std::__cxx11::string::end();
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)result,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )it._M_current,__last);
      std::__cxx11::string::append((ulong)result,(char)span_begin._M_current);
      std::__cxx11::string::push_back((char)result);
    }
    else {
      std::__cxx11::string::append((string *)result);
    }
    return;
  }
  __assert_fail("result",
                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/util.cc"
                ,0x11c,"void GetWin32EscapedString(const string &, string *)");
}

Assistant:

void GetWin32EscapedString(const string& input, string* result) {
  assert(result);
  if (!StringNeedsWin32Escaping(input)) {
    result->append(input);
    return;
  }

  const char kQuote = '"';
  const char kBackslash = '\\';

  result->push_back(kQuote);
  size_t consecutive_backslash_count = 0;
  string::const_iterator span_begin = input.begin();
  for (string::const_iterator it = input.begin(), end = input.end(); it != end;
       ++it) {
    switch (*it) {
      case kBackslash:
        ++consecutive_backslash_count;
        break;
      case kQuote:
        result->append(span_begin, it);
        result->append(consecutive_backslash_count + 1, kBackslash);
        span_begin = it;
        consecutive_backslash_count = 0;
        break;
      default:
        consecutive_backslash_count = 0;
        break;
    }
  }
  result->append(span_begin, input.end());
  result->append(consecutive_backslash_count, kBackslash);
  result->push_back(kQuote);
}